

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_perform(CURL *easy)

{
  uint uVar1;
  CURLMcode CVar2;
  Curl_multi *multi_handle;
  long lVar3;
  CURLMsg *pCVar4;
  ulong uVar5;
  int timeout_ms;
  CURLcode CVar6;
  bool bVar7;
  timeval older;
  timeval newer;
  CURLcode local_54;
  int still_running;
  int ret;
  ulong local_48;
  CURL *local_40;
  int local_34;
  
  if (easy == (CURL *)0x0) {
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (*(long *)((long)easy + 0x60) == 0) {
    multi_handle = *(Curl_multi **)((long)easy + 0x68);
    if (multi_handle == (Curl_multi *)0x0) {
      multi_handle = Curl_multi_handle(1,3);
      if (multi_handle == (Curl_multi *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(Curl_multi **)((long)easy + 0x68) = multi_handle;
    }
    curl_multi_setopt(multi_handle,CURLMOPT_MAXCONNECTS,*(undefined8 *)((long)easy + 0x698));
    CVar2 = curl_multi_add_handle(multi_handle,easy);
    if (CVar2 == CURLM_OK) {
      local_48 = 0;
      *(Curl_multi **)((long)easy + 0x60) = multi_handle;
      local_54 = CURLE_OK;
      CVar2 = CURLM_OK;
      local_40 = easy;
      do {
        bVar7 = false;
LAB_0045cd33:
        if ((bVar7) || (CVar2 != CURLM_OK)) {
          CVar6 = (uint)(CVar2 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
          if (CVar2 == CURLM_OK) {
            CVar6 = local_54;
          }
LAB_0045ce29:
          curl_multi_remove_handle(multi_handle,local_40);
          return CVar6;
        }
        still_running = 0;
        older = curlx_tvnow();
        CVar2 = curl_multi_wait(multi_handle,(curl_waitfd *)0x0,0,1000,&ret);
        if (CVar2 == CURLM_OK) {
          uVar5 = 0;
          if (ret == 0) {
            newer = curlx_tvnow();
            lVar3 = curlx_tvdiff(newer,older);
            if (lVar3 < 0xb) {
              uVar1 = (uint)local_48;
              uVar5 = (ulong)(uVar1 + 1);
              if (1 < (int)uVar1) {
                timeout_ms = 1 << ((byte)local_48 & 0x1f);
                if (8 < uVar1) {
                  timeout_ms = 1000;
                }
                Curl_wait_ms(timeout_ms);
              }
            }
          }
          else if (ret == -1) {
            CVar6 = CURLE_RECV_ERROR;
            goto LAB_0045ce29;
          }
          CVar2 = curl_multi_perform(multi_handle,&still_running);
          local_48 = uVar5;
        }
      } while (still_running != 0 || CVar2 != CURLM_OK);
      pCVar4 = curl_multi_info_read(multi_handle,&local_34);
      bVar7 = pCVar4 != (CURLMsg *)0x0;
      if (bVar7) {
        local_54 = (pCVar4->data).result;
      }
      goto LAB_0045cd33;
    }
    curl_multi_cleanup(multi_handle);
    CVar6 = CURLE_OUT_OF_MEMORY;
    if (CVar2 != CURLM_OUT_OF_MEMORY) {
      CVar6 = CURLE_FAILED_INIT;
    }
  }
  else {
    Curl_failf((SessionHandle *)easy,"easy handle already used in multi handle");
    CVar6 = CURLE_FAILED_INIT;
  }
  return CVar6;
}

Assistant:

static CURLcode easy_perform(struct SessionHandle *data, bool events)
{
  CURLM *multi;
  CURLMcode mcode;
  CURLcode code = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    else
      return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  code = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return code;
}